

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddExecutableCommand.h
# Opt level: O0

cmCommand * __thiscall cmAddExecutableCommand::Clone(cmAddExecutableCommand *this)

{
  cmCommand *this_00;
  cmAddExecutableCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmAddExecutableCommand((cmAddExecutableCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() override { return new cmAddExecutableCommand; }